

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.h
# Opt level: O0

string * __thiscall
google::ReadEntireFile_abi_cxx11_(string *__return_storage_ptr__,google *this,FILE *file)

{
  ulong uVar1;
  size_t __n;
  char *pcVar2;
  bool local_91;
  allocator local_61;
  ulong local_60;
  size_t bytes_read;
  size_t bytes_last_read;
  allocator_type local_39;
  undefined1 local_38 [8];
  vector<char,_std::allocator<char>_> content;
  size_t file_size;
  FILE *file_local;
  
  __n = GetFileSize((FILE *)this);
  content.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = __n;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_38,__n,&local_39);
  std::allocator<char>::~allocator(&local_39);
  bytes_read = 0;
  local_60 = 0;
  fseek((FILE *)this,0,0);
  do {
    pcVar2 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)local_38);
    bytes_read = fread(pcVar2 + local_60,1,
                       content.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ -
                       local_60,(FILE *)this);
    local_60 = bytes_read + local_60;
    local_91 = bytes_read != 0 &&
               local_60 <
               (ulong)content.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_;
  } while (local_91);
  pcVar2 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)local_38);
  uVar1 = local_60;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,uVar1,&local_61);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_38)
  ;
  return __return_storage_ptr__;
}

Assistant:

static inline string ReadEntireFile(FILE* file) {
  const size_t file_size = GetFileSize(file);
  std::vector<char> content(file_size);

  size_t bytes_last_read = 0;  // # of bytes read in the last fread()
  size_t bytes_read = 0;       // # of bytes read so far

  fseek(file, 0, SEEK_SET);

  // Keep reading the file until we cannot read further or the
  // pre-determined file size is reached.
  do {
    bytes_last_read =
        fread(content.data() + bytes_read, 1, file_size - bytes_read, file);
    bytes_read += bytes_last_read;
  } while (bytes_last_read > 0 && bytes_read < file_size);

  return std::string(content.data(), bytes_read);
}